

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KruskalMST.h
# Opt level: O1

double __thiscall KruskalMST::operator()(KruskalMST *this)

{
  pointer pEVar1;
  pointer pEVar2;
  int iVar3;
  int iVar4;
  socklen_t in_ECX;
  int N;
  pointer pEVar5;
  bool bVar6;
  UFS ufs;
  double local_48;
  UFS local_40;
  
  N = this->n;
  UFS::UFS(&local_40,N);
  pEVar1 = (this->edges).super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->edges).super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar1 == pEVar2) {
    local_48 = 0.0;
  }
  else {
    local_48 = 0.0;
    do {
      pEVar5 = pEVar1 + 1;
      iVar4 = pEVar1->to;
      iVar3 = UFS::find(&local_40,pEVar1->from);
      iVar4 = UFS::find(&local_40,iVar4);
      if (iVar3 == iVar4) {
        bVar6 = false;
      }
      else {
        UFS::connect(&local_40,pEVar1->from,(sockaddr *)(ulong)(uint)pEVar1->to,in_ECX);
        local_48 = local_48 + pEVar1->w;
        N = N + -1;
        bVar6 = N == 1;
      }
    } while ((!bVar6) && (pEVar1 = pEVar5, pEVar5 != pEVar2));
  }
  if ((_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
      local_40.fa._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (int *)0x0) {
    operator_delete__((void *)local_40.fa._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  return local_48;
}

Assistant:

double operator()() const
	{
		double ans = 0.0;
		int need = n;
		UFS ufs(n);
		for (auto &edge : edges)
		{
			if (!ufs.connected(edge.from, edge.to))
			{
				ufs.connect(edge.from, edge.to);
				ans += edge.w;
				if (--need == 1)
					break;
			}
		}
		return ans;
	}